

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O3

HT_Boolean ht_tcp_server_write_to_socket(HT_TCPServer *server,int sock_fd,char *buffer,size_t size)

{
  ssize_t sVar1;
  ulong uVar2;
  HT_Boolean HVar3;
  
  if (size == 0) {
LAB_0010a1cd:
    HVar3 = 1;
  }
  else {
    uVar2 = 0;
    HVar3 = 0;
    do {
      if (size < uVar2 || size - uVar2 == 0) goto LAB_0010a1cd;
      sVar1 = send(sock_fd,buffer + uVar2,size - uVar2,0);
      uVar2 = uVar2 + ((uint)sVar1 & 0x7fffffff);
    } while (0 < (int)(uint)sVar1);
  }
  return HVar3;
}

Assistant:

HT_Boolean
ht_tcp_server_write_to_socket(HT_TCPServer* server, int sock_fd, char* buffer, size_t size)
{
    (void) server;
    if (size == 0)
    {
        return HT_TRUE;
    }

    size_t sent = 0;

    while (sent < size)
    {
        int n = send(sock_fd, buffer + sent, size - sent, 0);

        if (n <= 0)
        {
            return HT_FALSE;
        }

        sent += n;
    }

    return HT_TRUE;
}